

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer-host.c
# Opt level: O0

int wpe_renderer_host_create_client(void)

{
  int iVar1;
  wpe_renderer_host_interface *pwVar2;
  void *pvVar3;
  
  if (wpe_renderer_host_create_client::s_renderer_host == (wpe_renderer_host *)0x0) {
    wpe_renderer_host_create_client::s_renderer_host =
         (wpe_renderer_host *)
         wpe_calloc_impl(1,0x10,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/renderer-host.c"
                         ,0x25);
    pwVar2 = (wpe_renderer_host_interface *)wpe_load_object("_wpe_renderer_host_interface");
    (wpe_renderer_host_create_client::s_renderer_host->base).interface = pwVar2;
    pvVar3 = (*((wpe_renderer_host_create_client::s_renderer_host->base).interface)->create)();
    (wpe_renderer_host_create_client::s_renderer_host->base).interface_data = pvVar3;
  }
  iVar1 = (*((wpe_renderer_host_create_client::s_renderer_host->base).interface)->create_client)
                    ((wpe_renderer_host_create_client::s_renderer_host->base).interface_data);
  return iVar1;
}

Assistant:

int
wpe_renderer_host_create_client()
{
    static struct wpe_renderer_host* s_renderer_host = 0;
    if (!s_renderer_host) {
        s_renderer_host = wpe_calloc(1, sizeof(struct wpe_renderer_host));
        s_renderer_host->base.interface = wpe_load_object("_wpe_renderer_host_interface");
        s_renderer_host->base.interface_data = s_renderer_host->base.interface->create();

        // FIXME: atexit() should clean up the object.
    }

    return s_renderer_host->base.interface->create_client(s_renderer_host->base.interface_data);
}